

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O0

void __thiscall WildMidi_Renderer::LongEvent(WildMidi_Renderer *this,uchar *data,int len)

{
  int iVar1;
  undefined8 local_3f;
  uchar yamaha_reset [9];
  uchar gm_reset [6];
  _event_data ev;
  uint uStack_20;
  uchar sysex_ch;
  int i;
  int cksum;
  int len_local;
  uchar *data_local;
  WildMidi_Renderer *this_local;
  
  if (((((len < 0xb) || (data[len + -1] != 0xf7)) || (*data != 0xf0)) ||
      ((data[1] != 'A' || (data[2] != '\x10')))) ||
     ((data[3] != 'B' || ((data[4] != '\x12' || (data[5] != '@')))))) {
    yamaha_reset[1] = 0xf0;
    yamaha_reset[2] = '~';
    yamaha_reset[3] = '\x7f';
    yamaha_reset[4] = '\t';
    yamaha_reset[5] = '\x01';
    yamaha_reset[6] = 0xf7;
    local_3f = 0x7e00004c1043f0;
    yamaha_reset[0] = 0xf7;
    if ((len == 6) && (iVar1 = memcmp(yamaha_reset + 1,data,6), iVar1 == 0)) {
      do_sysex_gm_reset((_mdi *)this->handle,(_event_data *)0x0);
    }
    else if ((len == 9) && (iVar1 = memcmp(&local_3f,data,9), iVar1 == 0)) {
      do_sysex_yamaha_reset((_mdi *)this->handle,(_event_data *)0x0);
    }
  }
  else {
    uStack_20 = 0;
    for (ev.data = 5; (int)ev.data < len + -2; ev.data = ev.data + 1) {
      uStack_20 = data[(int)ev.data] + uStack_20;
    }
    if ((uint)data[len + -2] == 0x80 - (uStack_20 & 0x7f)) {
      if (((data[6] & 0xf0) == 0x10) && (data[7] == '\x15')) {
        ev._3_1_ = data[6] & 0xf;
        if (ev._3_1_ == 0) {
          ev._3_1_ = 9;
        }
        else if ((byte)ev._3_1_ < 10) {
          ev._3_1_ = ev._3_1_ - 1;
        }
        yamaha_reset[7] = ev._3_1_;
        do_sysex_roland_drum_track((_mdi *)this->handle,(_event_data *)(yamaha_reset + 7));
      }
      else if ((data[6] == '\0') && ((data[7] == '\x7f' && (data[8] == '\0')))) {
        do_sysex_roland_reset((_mdi *)this->handle,(_event_data *)0x0);
      }
    }
  }
  return;
}

Assistant:

void WildMidi_Renderer::LongEvent(const unsigned char *data, int len)
{
	// Check for Roland SysEx
	if (len >= 11 &&			// Must be at least 11 bytes
		data[len-1] == 0xF7 &&	// SysEx end
		data[0] == 0xF0 &&		// SysEx
		data[1] == 0x41 &&		// Roland
		data[2] == 0x10 &&		// Device ID, defaults to 0x10
		data[3] == 0x42 &&		// Model ID, 0x42 indicates a GS synth
		data[4] == 0x12 &&		// The other end is sending data to us
		data[5] == 0x40)		// We only care about addresses with this first byte
	{
		// Calculate checksum
		int cksum = 0;
		for (int i = 5; i < len - 2; ++i)
		{
			cksum += data[i];
		}
		cksum = 128 - (cksum & 0x7F);
		if (data[len-2] == cksum)
		{ // Check destination address
			if (((data[6] & 0xF0) == 0x10) && data[7] == 0x15)
			{ // Roland drum track setting
				unsigned char sysex_ch = data[6] & 0x0F;
				if (sysex_ch == 0)
				{
					sysex_ch = 9;
				}
				else if (sysex_ch <= 9)
				{
					sysex_ch -= 1;
				}
				_event_data ev = { sysex_ch, data[8] };
				do_sysex_roland_drum_track((_mdi *)handle, &ev);
			}
			else if (data[6] == 0x00 && data[7] == 0x7F && data[8] == 0x00)
			{ // Roland GS reset
				do_sysex_roland_reset((_mdi *)handle, NULL);
			}
		}
	}
	// For non-Roland Sysex messages */
	else
	{
		const unsigned char gm_reset[] = { 0xf0, 0x7e, 0x7f, 0x09, 0x01, 0xf7 };
		const unsigned char yamaha_reset[] = { 0xf0, 0x43, 0x10, 0x4c, 0x00, 0x00, 0x7e, 0x00, 0xf7};
		if (len == 6 && memcmp(gm_reset, data, 6) == 0)
		{
			do_sysex_gm_reset((_mdi *)handle, NULL);
		}
		else if (len == 9 && memcmp(yamaha_reset, data, 9) == 0)
		{
			do_sysex_yamaha_reset((_mdi *)handle, NULL);
		}
	}
}